

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expand.c
# Opt level: O1

int compare_expressions(void *userdata,void *_a,void *_b)

{
  uint uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  
  uVar2 = bit_offset((dmr_C *)userdata,(expression *)_a);
  uVar3 = bit_offset((dmr_C *)userdata,(expression *)_b);
  uVar1 = 0xffffffff;
  if (uVar3 <= uVar2) {
    uVar1 = (uint)(uVar2 != uVar3);
  }
  return uVar1;
}

Assistant:

static int compare_expressions(void *userdata, const void *_a, const void *_b)
{
	struct dmr_C *C = (struct dmr_C *) userdata;
	const struct expression *a = (const struct expression *)_a;
	const struct expression *b = (const struct expression *)_b;
	unsigned long a_pos = bit_offset(C, a);
	unsigned long b_pos = bit_offset(C, b);

	return (a_pos < b_pos) ? -1 : (a_pos == b_pos) ? 0 : 1;
}